

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O0

sexp_conflict
sexp_bytevector_s32_set_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg1,sexp_conflict arg2,
          sexp_conflict arg3,sexp_conflict arg4)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int *in_RCX;
  long lVar4;
  undefined8 in_RSI;
  sexp_conflict in_RDI;
  int *in_R8;
  int *in_R9;
  sexp_conflict res;
  undefined4 in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *arg1_00;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 8)) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if ((((ulong)in_R9 & 1) == 1) || ((((ulong)in_R9 & 3) == 0 && (*in_R9 == 0xc)))) {
        lVar4 = (long)in_R8 >> 0x3f;
        if (((ulong)in_R8 & 1) == 1) {
          auVar1._8_8_ = lVar4;
          auVar1._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
          local_48 = SUB168(auVar1 / SEXT816(2),0);
        }
        else {
          if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
            local_50 = (long)(char)in_R8[2] * *(long *)(in_R8 + 6);
          }
          else {
            local_50 = 0;
          }
          local_48 = local_50;
        }
        if (-1 < local_48) {
          if (((ulong)in_R8 & 1) == 1) {
            auVar2._8_8_ = lVar4;
            auVar2._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
            local_58 = SUB168(auVar2 / SEXT816(2),0);
          }
          else {
            if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
              local_60 = (long)(char)in_R8[2] * *(long *)(in_R8 + 6);
            }
            else {
              local_60 = 0;
            }
            local_58 = local_60;
          }
          if (local_58 < *(ulong *)(in_RCX + 2)) {
            if (((ulong)in_R8 & 1) == 1) {
              auVar3._8_8_ = lVar4;
              auVar3._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
              arg1_00 = SUB168(auVar3 / SEXT816(2),0);
            }
            else if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
              in_stack_ffffffffffffff80 = (char *)((long)(char)in_R8[2] * *(long *)(in_R8 + 6));
              arg1_00 = in_stack_ffffffffffffff80;
            }
            else {
              in_stack_ffffffffffffff80 = (char *)0x0;
              arg1_00 = in_stack_ffffffffffffff80;
            }
            bytevector_s32_set_x
                      (in_RDI,arg1_00,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (int32_t)in_stack_ffffffffffffff80,
                       (sexp_conflict)CONCAT44((int)arg1_00,in_stack_ffffffffffffff78));
            return (sexp_conflict)0x43e;
          }
        }
        local_8 = (sexp_conflict)
                  sexp_user_exception_ls
                            (in_RDI,in_RSI,"assertion failed: (< -1 arg2 (bytevector-length arg1))",
                             2,in_R8,*(long *)(in_RCX + 2) << 1 | 1);
      }
      else {
        local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R9);
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,8,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_bytevector_s32_set_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg1, sexp arg2, sexp arg3, sexp arg4) {
  sexp res;
  if (! sexp_bytesp(arg1))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  if (! sexp_exact_integerp(arg3))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg3);
  if (!((-1 < sexp_sint_value(arg2)) && (sexp_sint_value(arg2) < sexp_bytes_length(arg1)))) {
    return sexp_user_exception_ls(ctx, self, "assertion failed: " "(< -1 arg2 (bytevector-length arg1))", 2, arg2, sexp_make_fixnum(sexp_bytes_length(arg1)));
  }
  res = ((bytevector_s32_set_x(ctx, sexp_bytes_data(arg1), sexp_sint_value(arg2), sexp_sint_value(arg3), arg4)), SEXP_VOID);
  return res;
}